

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void sort_constraints(TCGOpDef *def,int start,int n)

{
  int k;
  int k_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  lVar6 = (long)start;
  uVar5 = 0;
  lVar7 = lVar6;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
    def->sorted_args[lVar7] = (int)lVar7;
    lVar7 = lVar7 + 1;
  }
  if (1 < n) {
    iVar4 = 1;
    for (uVar5 = 0; uVar5 != n - 1; uVar5 = uVar5 + 1) {
      for (lVar7 = (long)iVar4; lVar7 < (long)(ulong)(uint)n; lVar7 = lVar7 + 1) {
        piVar1 = def->sorted_args;
        k = piVar1[uVar5 + lVar6];
        iVar2 = get_constraint_priority(def,k);
        k_00 = piVar1[lVar6 + lVar7];
        iVar3 = get_constraint_priority(def,k_00);
        if (iVar2 < iVar3) {
          piVar1[uVar5 + lVar6] = k_00;
          piVar1[lVar6 + lVar7] = k;
        }
      }
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

static void sort_constraints(TCGOpDef *def, int start, int n)
{
    int i, j, p1, p2, tmp;

    for(i = 0; i < n; i++)
        def->sorted_args[start + i] = start + i;
    if (n <= 1)
        return;
    for(i = 0; i < n - 1; i++) {
        for(j = i + 1; j < n; j++) {
            p1 = get_constraint_priority(def, def->sorted_args[start + i]);
            p2 = get_constraint_priority(def, def->sorted_args[start + j]);
            if (p1 < p2) {
                tmp = def->sorted_args[start + i];
                def->sorted_args[start + i] = def->sorted_args[start + j];
                def->sorted_args[start + j] = tmp;
            }
        }
    }
}